

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  internal *piVar4;
  TestResult *result;
  ostream *poVar5;
  TestCase *pTVar6;
  int width;
  TimeInMillis ms;
  TimeInMillis ms_00;
  long in_FS_OFFSET;
  int local_204;
  int i;
  bool comma;
  UnitTest *unit_test_local;
  ostream *stream_local;
  allocator<char> local_1d8;
  allocator<char> local_1d7;
  allocator<char> local_1d6;
  allocator<char> local_1d5;
  allocator<char> local_1d4;
  allocator<char> local_1d3;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 local_50 [8];
  string kIndent;
  string kTestsuites;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(kIndent.field_2._M_local_buf + 8),"testsuites",&local_1d1);
  std::allocator<char>::~allocator(&local_1d1);
  Indent_abi_cxx11_((string *)local_50,(internal *)0x2,width);
  std::operator<<(stream,"{\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"tests",&local_1d2);
  iVar3 = UnitTest::reportable_test_count(unit_test);
  OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_70,iVar3,(string *)local_50,
                true);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_1d2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"failures",&local_1d3);
  iVar3 = UnitTest::failed_test_count(unit_test);
  OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_90,iVar3,(string *)local_50,
                true);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_1d3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"disabled",&local_1d4);
  iVar3 = UnitTest::reportable_disabled_test_count(unit_test);
  OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_b0,iVar3,(string *)local_50,
                true);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_1d4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"errors",&local_1d5);
  OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_d0,0,(string *)local_50,true);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_1d5);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"random_seed",&local_1d6)
    ;
    iVar3 = UnitTest::random_seed(unit_test);
    OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_f0,iVar3,(string *)local_50,
                  true);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_1d6);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"timestamp",&local_1d7);
  piVar4 = (internal *)UnitTest::start_timestamp(unit_test);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(&local_130,piVar4,ms);
  OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_110,&local_130,
                (string *)local_50,true);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_1d7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"time",&local_1d8);
  piVar4 = (internal *)UnitTest::elapsed_time(unit_test);
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_170,piVar4,ms_00);
  OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_150,&local_170,
                (string *)local_50,false);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_1d8);
  result = UnitTest::ad_hoc_test_result(unit_test);
  TestPropertiesAsJson(&local_190,result,(string *)local_50);
  poVar5 = std::operator<<(stream,(string *)&local_190);
  std::operator<<(poVar5,",\n");
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"name",(allocator<char> *)((long)&stream_local + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"AllTests",(allocator<char> *)((long)&stream_local + 6));
  OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_1b0,&local_1d0,
                (string *)local_50,true);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 6));
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 7));
  poVar5 = std::operator<<(stream,(string *)local_50);
  poVar5 = std::operator<<(poVar5,"\"");
  poVar5 = std::operator<<(poVar5,(string *)(kIndent.field_2._M_local_buf + 8));
  std::operator<<(poVar5,"\": [\n");
  bVar2 = false;
  local_204 = 0;
  while( true ) {
    iVar3 = UnitTest::total_test_case_count(unit_test);
    if (iVar3 <= local_204) break;
    pTVar6 = UnitTest::GetTestCase(unit_test,local_204);
    iVar3 = TestCase::reportable_test_count(pTVar6);
    if (0 < iVar3) {
      if (bVar2) {
        std::operator<<(stream,",\n");
      }
      else {
        bVar2 = true;
      }
      pTVar6 = UnitTest::GetTestCase(unit_test,local_204);
      PrintJsonTestCase(stream,pTVar6);
    }
    local_204 = local_204 + 1;
  }
  poVar5 = std::operator<<(stream,"\n");
  poVar5 = std::operator<<(poVar5,(string *)local_50);
  poVar5 = std::operator<<(poVar5,"]\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestCase(stream, *unit_test.GetTestCase(i));
    }
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}